

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *outputConfig,string *commandConfig,string *customStep,
          cmGeneratorTarget *target)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined1 local_3d8 [8];
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ofstream script;
  cmAlphaNum local_168;
  string local_138;
  Status local_118;
  string local_110 [32];
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  string local_90;
  string local_60;
  byte local_39;
  string *local_38;
  string *customStep_local;
  string *commandConfig_local;
  string *outputConfig_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLines_local;
  cmLocalNinjaGenerator *this_local;
  string *scriptPath;
  
  local_39 = 0;
  local_38 = customStep;
  customStep_local = commandConfig;
  commandConfig_local = outputConfig;
  outputConfig_local = (string *)cmdLines;
  cmdLines_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (target == (cmGeneratorTarget *)0x0) {
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmAlphaNum::cmAlphaNum(&local_c0,psVar3);
    cmAlphaNum::cmAlphaNum(&local_f0,"/CMakeFiles");
    cmStrCat<>(&local_90,&local_c0,&local_f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_60,target);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pcVar4 = GetGlobalNinjaGenerator(this);
  (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (local_110,pcVar4,commandConfig_local);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_110);
  std::__cxx11::string::~string(local_110);
  local_118 = cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_38);
  uVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if ((uVar2 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_168,'-');
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&script.field_0x1f8,customStep_local);
    cmStrCat<>(&local_138,&local_168,(cmAlphaNum *)&script.field_0x1f8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".sh");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&__range1,pcVar5,_S_out);
  std::operator<<((ostream *)&__range1,"set -e\n\n");
  psVar3 = outputConfig_local;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)outputConfig_local);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i), bVar1) {
    cmd.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_3d8,(string *)cmd.field_2._8_8_);
    cmsys::SystemTools::ReplaceString((string *)local_3d8,"$$","$");
    poVar6 = std::operator<<((ostream *)&__range1,(string *)local_3d8);
    std::operator<<(poVar6,'\n');
    std::__cxx11::string::~string((string *)local_3d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_39 = 1;
  std::ofstream::~ofstream(&__range1);
  if ((local_39 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& outputConfig,
  std::string const& commandConfig, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles");
  }
  scriptPath += this->GetGlobalNinjaGenerator()->ConfigDirectory(outputConfig);
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
  if (this->GlobalGenerator->IsMultiConfig()) {
    scriptPath += cmStrCat('-', commandConfig);
  }
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}